

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uecc.c
# Opt level: O3

int secp256r1_key_exchange
              (ptls_key_exchange_algorithm_t *algo,ptls_iovec_t *pubkey,ptls_iovec_t *secret,
              ptls_iovec_t peerkey)

{
  int iVar1;
  uint8_t *__ptr;
  uint8_t *secret_00;
  uECC_Curve puVar2;
  int iVar3;
  uint8_t priv [32];
  uint8_t local_58 [40];
  
  iVar3 = 0x33;
  if ((peerkey.len == 0x41) && (*peerkey.base == '\x04')) {
    __ptr = (uint8_t *)malloc(0x41);
    if (__ptr != (uint8_t *)0x0) {
      secret_00 = (uint8_t *)malloc(0x20);
      if (secret_00 == (uint8_t *)0x0) {
        secret_00 = (uint8_t *)0x0;
        iVar3 = 0x201;
      }
      else {
        *__ptr = '\x04';
        puVar2 = uECC_secp256r1();
        uECC_make_key(__ptr + 1,local_58,puVar2);
        puVar2 = uECC_secp256r1();
        iVar1 = uECC_shared_secret(peerkey.base + 1,local_58,secret_00,puVar2);
        if (iVar1 != 0) {
          pubkey->base = __ptr;
          pubkey->len = 0x41;
          secret->base = secret_00;
          secret->len = 0x20;
          (*ptls_clear_memory)(local_58,0x20);
          return 0;
        }
      }
      goto LAB_00120fcc;
    }
    iVar3 = 0x201;
  }
  secret_00 = (uint8_t *)0x0;
  __ptr = (uint8_t *)0x0;
LAB_00120fcc:
  (*ptls_clear_memory)(local_58,0x20);
  free(secret_00);
  free(__ptr);
  return iVar3;
}

Assistant:

static int secp256r1_key_exchange(ptls_key_exchange_algorithm_t *algo, ptls_iovec_t *pubkey, ptls_iovec_t *secret,
                                  ptls_iovec_t peerkey)
{
    uint8_t priv[SECP256R1_PRIVATE_KEY_SIZE], *pub = NULL, *secbytes = NULL;
    int ret;

    if (peerkey.len != SECP256R1_PUBLIC_KEY_SIZE || peerkey.base[0] != TYPE_UNCOMPRESSED_PUBLIC_KEY) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    if ((pub = malloc(SECP256R1_PUBLIC_KEY_SIZE)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    if ((secbytes = malloc(SECP256R1_SHARED_SECRET_SIZE)) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }

    pub[0] = TYPE_UNCOMPRESSED_PUBLIC_KEY;
    uECC_make_key(pub + 1, priv, uECC_secp256r1());
    if (!uECC_shared_secret(peerkey.base + 1, priv, secbytes, uECC_secp256r1())) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    *pubkey = ptls_iovec_init(pub, SECP256R1_PUBLIC_KEY_SIZE);
    *secret = ptls_iovec_init(secbytes, SECP256R1_SHARED_SECRET_SIZE);
    ret = 0;

Exit:
    ptls_clear_memory(priv, sizeof(priv));
    if (ret != 0) {
        free(secbytes);
        free(pub);
    }
    return ret;
}